

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Vocoder.cpp
# Opt level: O0

int Vocoder::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  EffectData *pEVar1;
  Data *data;
  float value_local;
  int index_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<Vocoder::EffectData>(state);
  if ((index < 0) || (6 < index)) {
    state_local._4_4_ = 1;
  }
  else {
    *(float *)((long)&pEVar1->field_0 + (long)index * 4) = value;
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (index < 0 || index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        return UNITY_AUDIODSP_OK;
    }